

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O3

double __thiscall
GammaHandler::photoIonization
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  pointer pvVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  pvVar1 = (sourceInfo->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar7 = 0.0;
  lVar3 = (long)(sourceInfo->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar3 != 0) {
    lVar2 = (lVar3 >> 3) * -0x5555555555555555;
    lVar4 = 0;
    lVar3 = 0;
    bVar6 = false;
    pvVar5 = pvVar1;
    do {
      dVar8 = ABS(*(xyTry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start -
                  *(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start);
      if (dVar8 < brThresh) {
        lVar3 = lVar4;
      }
      bVar6 = (bool)(bVar6 | dVar8 < brThresh);
      lVar4 = lVar4 + 1;
      pvVar5 = pvVar5 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
    if (bVar6) {
      lVar3 = *(long *)&pvVar1[lVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl;
      dVar7 = (*(double *)(lVar3 + 0x10) /
              (*(double *)(lVar3 + 0x18) + *(double *)(lVar3 + 0x10) + *(double *)(lVar3 + 0x20))) *
              *(double *)(lVar3 + 8) * yMax;
    }
  }
  return dVar7;
}

Assistant:

double GammaHandler::photoIonization(const vector<vector<double>>& sourceInfo,
                                     const vector<double>& xyTry) {
  // implement simple delta function to the spectrum
  std::size_t index{0};
  bool found = false;
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    if (abs(xyTry[0] - initialEnergy) < brThresh) {
      index = i;
      found = true;
    }
  }
  double br = sourceInfo[index][1];
  double pe = sourceInfo[index][2];
  double co = sourceInfo[index][3];
  double pp = sourceInfo[index][4];
  if (found) return yMax * br * (pe / (pe + co + pp));
  return 0.0;
}